

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void GradientFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  uint8_t *unaff_retaddr;
  undefined4 in_stack_00000010;
  
  DoGradientFilter_SSE2
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX,in_ECX,
             (uint8_t *)CONCAT44(stride,in_stack_00000010));
  return;
}

Assistant:

static void GradientFilter_SSE2(const uint8_t* data, int width, int height,
                                int stride, uint8_t* filtered_data) {
  DoGradientFilter_SSE2(data, width, height, stride, 0, height, filtered_data);
}